

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLast
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  __pointer_type pNVar1;
  Node *pNVar2;
  int iVar3;
  Node *pNVar4;
  bool bVar5;
  
  iVar3 = (this->max_height_).super___atomic_base<int>._M_i + -1;
  pNVar1 = this->head_;
  do {
    pNVar2 = pNVar1;
    for (pNVar4 = (Node *)(pNVar2->next_ + iVar3); pNVar1 = ((__base_type *)&pNVar4->key)->_M_p,
        pNVar1 == (__pointer_type)0x0; pNVar4 = (Node *)((long)(pNVar4 + 0xffffffffffffffff) + 8)) {
      bVar5 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar5) {
        return pNVar2;
      }
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node* SkipList<Key, Comparator>::FindLast()
    const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (next == nullptr) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}